

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O3

void __thiscall
wasm::OptimizeInstructions::skipNonNullCast
          (OptimizeInstructions *this,Expression **input,Expression *parent)

{
  PassRunner *pPVar1;
  Expression *ast;
  bool bVar2;
  bool bVar3;
  Index IVar4;
  bool *pbVar5;
  Index IVar6;
  byte bVar7;
  Index index;
  Expression *pEVar8;
  undefined1 local_340 [8];
  ShallowEffectAnalyzer movingEffects;
  EffectAnalyzer crossedEffects;
  
  pEVar8 = *input;
  if (pEVar8->_id == RefAsId) {
    pPVar1 = (this->
             super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
             ).super_Pass.runner;
    bVar2 = false;
    crossedEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this;
    do {
      if (*(int *)(pEVar8 + 1) != 0) {
        return;
      }
      bVar3 = !bVar2;
      bVar2 = true;
      if (bVar3) {
        movingEffects.super_EffectAnalyzer.delegateTargets._M_t._M_impl.super__Rb_tree_header.
        _M_node_count._1_1_ = (pPVar1->options).trapsNeverHappen;
        if ((bool)movingEffects.super_EffectAnalyzer.delegateTargets._M_t._M_impl.
                  super__Rb_tree_header._M_node_count._1_1_ == false) {
          crossedEffects._0_8_ =
               (this->
               super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
               ).
               super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
               .
               super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
               .currModule;
          movingEffects.super_EffectAnalyzer.delegateTargets._M_t._M_impl.super__Rb_tree_header.
          _M_node_count._0_1_ = (pPVar1->options).ignoreImplicitTraps;
          crossedEffects.module._0_4_ = (((Module *)crossedEffects._0_8_)->features).features;
          crossedEffects.module._4_2_ = 0;
          crossedEffects.localsRead._M_t._M_impl._0_4_ = 0;
          crossedEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          crossedEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
          crossedEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)&crossedEffects.localsRead;
          crossedEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               (_Base_ptr)0x0;
          crossedEffects.localsWritten._M_t._M_impl._0_4_ = 0;
          crossedEffects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
               _S_red;
          crossedEffects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
          crossedEffects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)&crossedEffects.localsWritten;
          crossedEffects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               (_Base_ptr)0x0;
          crossedEffects.mutableGlobalsRead._M_t._M_impl._0_4_ = 0;
          crossedEffects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
               _S_red;
          crossedEffects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
          crossedEffects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)&crossedEffects.mutableGlobalsRead;
          crossedEffects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               (_Base_ptr)0x0;
          crossedEffects.globalsWritten._M_t._M_impl._0_4_ = 0;
          crossedEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
               _S_red;
          crossedEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
          crossedEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)&crossedEffects.globalsWritten;
          crossedEffects.breakTargets._M_t._M_impl._0_4_ = 0;
          crossedEffects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red
          ;
          crossedEffects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
          crossedEffects.readsMemory = false;
          crossedEffects.writesMemory = false;
          crossedEffects.readsTable = false;
          crossedEffects.writesTable = false;
          crossedEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               (_Base_ptr)0x0;
          crossedEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          crossedEffects.trap = false;
          crossedEffects.implicitTrap = false;
          crossedEffects.isAtomic = false;
          crossedEffects.throws_ = false;
          crossedEffects._228_4_ = 0;
          crossedEffects.tryDepth._0_7_ = 0;
          crossedEffects._239_4_ = 0;
          crossedEffects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)&crossedEffects.breakTargets;
          crossedEffects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               (_Base_ptr)0x0;
          crossedEffects.delegateTargets._M_t._M_impl._0_4_ = 0;
          crossedEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
               _S_red;
          crossedEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
          crossedEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)&crossedEffects.delegateTargets;
          crossedEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               (_Base_ptr)0x0;
          crossedEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               crossedEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          crossedEffects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               crossedEffects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          crossedEffects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               crossedEffects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header.
               _M_parent;
          crossedEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               crossedEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          crossedEffects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               crossedEffects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          crossedEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               crossedEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
          ;
          AbstractChildIterator<wasm::ChildIterator>::AbstractChildIterator
                    ((AbstractChildIterator<wasm::ChildIterator> *)local_340,parent);
          IVar6 = (int)((ulong)((long)movingEffects.super_EffectAnalyzer.localsRead._M_t._M_impl.
                                      super__Rb_tree_header._M_header._M_parent -
                               movingEffects.super_EffectAnalyzer.localsRead._M_t._M_impl.
                               super__Rb_tree_header._M_header._0_8_) >> 3) + local_340._0_4_;
          if (IVar6 != 0) {
            bVar7 = 0;
            index = 0;
            do {
              IVar4 = AbstractChildIterator<wasm::ChildIterator>::mapIndex
                                ((AbstractChildIterator<wasm::ChildIterator> *)local_340,index);
              pbVar5 = (bool *)(movingEffects.super_EffectAnalyzer.localsRead._M_t._M_impl.
                                super__Rb_tree_header._M_header._0_8_ + -0x20 + (ulong)IVar4 * 8);
              if (IVar4 < 4) {
                pbVar5 = &movingEffects.super_EffectAnalyzer.ignoreImplicitTraps + (ulong)IVar4 * 8;
              }
              ast = (Expression *)**(undefined8 **)pbVar5;
              if ((bool)(~bVar7 & 1 | ast == *input)) {
                bVar7 = bVar7 | ast == *input;
              }
              else {
                EffectAnalyzer::walk
                          ((EffectAnalyzer *)
                           &movingEffects.super_EffectAnalyzer.delegateTargets._M_t._M_impl.
                            super__Rb_tree_header._M_node_count,ast);
              }
              index = index + 1;
            } while (IVar6 != index);
          }
          if (movingEffects.super_EffectAnalyzer.localsRead._M_t._M_impl.super__Rb_tree_header.
              _M_header._0_8_ != 0) {
            operator_delete((void *)movingEffects.super_EffectAnalyzer.localsRead._M_t._M_impl.
                                    super__Rb_tree_header._M_header._0_8_,
                            (long)movingEffects.super_EffectAnalyzer.localsRead._M_t._M_impl.
                                  super__Rb_tree_header._M_header._M_left -
                            movingEffects.super_EffectAnalyzer.localsRead._M_t._M_impl.
                            super__Rb_tree_header._M_header._0_8_);
          }
          this = (OptimizeInstructions *)
                 crossedEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count;
          ShallowEffectAnalyzer::ShallowEffectAnalyzer
                    ((ShallowEffectAnalyzer *)local_340,&pPVar1->options,
                     *(Module **)
                      (crossedEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                       _M_node_count + 0x128),*input);
          bVar3 = EffectAnalyzer::invalidates
                            ((EffectAnalyzer *)
                             &movingEffects.super_EffectAnalyzer.delegateTargets._M_t._M_impl.
                              super__Rb_tree_header._M_node_count,(EffectAnalyzer *)local_340);
          std::
          _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
          ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                       *)&movingEffects.super_EffectAnalyzer.breakTargets._M_t._M_impl.
                          super__Rb_tree_header._M_node_count);
          std::
          _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
          ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                       *)&movingEffects.super_EffectAnalyzer.danglingPop);
          std::
          _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
          ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                       *)&movingEffects.super_EffectAnalyzer.mutableGlobalsRead._M_t._M_impl.
                          super__Rb_tree_header._M_node_count);
          std::
          _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
          ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                       *)&movingEffects.super_EffectAnalyzer.localsWritten._M_t._M_impl.
                          super__Rb_tree_header._M_node_count);
          std::
          _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
          ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                       *)&movingEffects.super_EffectAnalyzer.localsRead._M_t._M_impl.
                          super__Rb_tree_header._M_node_count);
          std::
          _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
          ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                       *)&movingEffects.super_EffectAnalyzer.features);
          std::
          _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
          ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                       *)&crossedEffects.breakTargets._M_t._M_impl.super__Rb_tree_header.
                          _M_node_count);
          std::
          _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
          ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                       *)&crossedEffects.danglingPop);
          std::
          _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
          ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                       *)&crossedEffects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header.
                          _M_node_count);
          std::
          _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
          ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                       *)&crossedEffects.localsWritten._M_t._M_impl.super__Rb_tree_header.
                          _M_node_count);
          std::
          _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
          ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                       *)&crossedEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_node_count
                     );
          std::
          _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
          ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                       *)&crossedEffects.features);
          bVar2 = true;
          if (bVar3) {
            return;
          }
        }
        else {
          bVar2 = false;
        }
      }
      pEVar8 = (Expression *)pEVar8[1].type.id;
      *input = pEVar8;
    } while (pEVar8->_id == RefAsId);
  }
  return;
}

Assistant:

void skipNonNullCast(Expression*& input, Expression* parent) {
    // Check the other children for the ordering problem only if we find a
    // possible optimization, to avoid wasted work.
    bool checkedSiblings = false;
    auto& options = getPassOptions();
    while (1) {
      if (auto* as = input->dynCast<RefAs>()) {
        if (as->op == RefAsNonNull) {
          // The problem with effect ordering that is described above is not an
          // issue if traps are assumed to never happen anyhow.
          if (!checkedSiblings && !options.trapsNeverHappen) {
            // We need to see if a child with side effects exists after |input|.
            // If there is such a child, it is a problem as mentioned above (it
            // is fine for such a child to appear *before* |input|, as then we
            // wouldn't be reordering effects). Thus, all we need to do is
            // accumulate the effects in children after |input|, as we want to
            // move the trap across those.
            bool seenInput = false;
            EffectAnalyzer crossedEffects(options, *getModule());
            for (auto* child : ChildIterator(parent)) {
              if (child == input) {
                seenInput = true;
              } else if (seenInput) {
                crossedEffects.walk(child);
              }
            }

            // Check if the effects we cross interfere with the effects of the
            // trap we want to move. (We use a shallow effect analyzer since we
            // will only move the ref.as_non_null itself.)
            ShallowEffectAnalyzer movingEffects(options, *getModule(), input);
            if (crossedEffects.invalidates(movingEffects)) {
              return;
            }

            // If we got here, we've checked the siblings and found no problem.
            checkedSiblings = true;
          }
          input = as->value;
          continue;
        }
      }
      break;
    }
  }